

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::EmitAddtlInfo_SnapES5ArrayInfo(SnapObject *snpObject,FileWriter *writer)

{
  SnapES5ArrayInfo *pSVar1;
  SnapES5ArrayGetterSetterEntry *pSVar2;
  SnapES5ArrayGetterSetterEntry *entry;
  Separator sep;
  uint32 i;
  SnapES5ArrayInfo *es5Info;
  FileWriter *writer_local;
  SnapObject *snpObject_local;
  
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapES5ArrayInfo*,(TTD::NSSnapObjects::SnapObjectType)22>
                     (snpObject);
  FileWriter::WriteLengthValue(writer,pSVar1->GetterSetterCount,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(pSVar1->IsLengthWritable & 1),1);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (entry._4_4_ = 0; entry._4_4_ < pSVar1->GetterSetterCount; entry._4_4_ = entry._4_4_ + 1) {
    pSVar2 = pSVar1->GetterSetterEntries + entry._4_4_;
    (*writer->_vptr_FileWriter[6])(writer,(ulong)(entry._4_4_ != 0));
    FileWriter::WriteUInt32(writer,index,pSVar2->Index,NoSeparator);
    FileWriter::WriteUInt32(writer,attributeFlags,(uint)pSVar2->Attributes,CommaSeparator);
    (*writer->_vptr_FileWriter[3])(writer,0x15,1);
    NSSnapValues::EmitTTDVar(pSVar2->Getter,writer,NoSeparator);
    (*writer->_vptr_FileWriter[3])(writer,0x16,1);
    NSSnapValues::EmitTTDVar(pSVar2->Setter,writer,NoSeparator);
    (*writer->_vptr_FileWriter[7])();
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  EmitAddtlInfo_SnapArrayInfoCore<void*>(pSVar1->BasicArrayData,writer);
  return;
}

Assistant:

void EmitAddtlInfo_SnapES5ArrayInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapES5ArrayInfo* es5Info = SnapObjectGetAddtlInfoAs<SnapES5ArrayInfo*, SnapObjectType::SnapES5ArrayObject>(snpObject);

            writer->WriteLengthValue(es5Info->GetterSetterCount, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, es5Info->IsLengthWritable, NSTokens::Separator::CommaSeparator);

            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < es5Info->GetterSetterCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                const SnapES5ArrayGetterSetterEntry* entry = es5Info->GetterSetterEntries + i;

                writer->WriteRecordStart(sep);

                writer->WriteUInt32(NSTokens::Key::index, entry->Index);
                writer->WriteUInt32(NSTokens::Key::attributeFlags, entry->Attributes, NSTokens::Separator::CommaSeparator);

                writer->WriteKey(NSTokens::Key::getterEntry, NSTokens::Separator::CommaSeparator);
                NSSnapValues::EmitTTDVar(entry->Getter, writer, NSTokens::Separator::NoSeparator);

                writer->WriteKey(NSTokens::Key::setterEntry, NSTokens::Separator::CommaSeparator);
                NSSnapValues::EmitTTDVar(entry->Setter, writer, NSTokens::Separator::NoSeparator);

                writer->WriteRecordEnd();
            }
            writer->WriteSequenceEnd();

            EmitAddtlInfo_SnapArrayInfoCore<TTDVar>(es5Info->BasicArrayData, writer);
        }